

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::
     call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
               (QPromise<QList<int>_> *promise,QPromiseResolve<QList<int>_> *resolve,
               QPromiseReject<QList<int>_> *reject)

{
  QPromiseReject<QList<int>> *this;
  QPromiseReject<QList<int>_> *this_00;
  QPromiseResolve<QList<int>_> *fulfilled;
  bool bVar1;
  PromiseValue<QList<int>_> *value;
  PromiseData<QList<int>_> *pPVar2;
  PromiseError *error;
  QPromiseReject<QList<int>_> local_70;
  QPromise<QList<int>_> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromise<void> local_30;
  QPromiseReject<QList<int>> *local_20;
  QPromiseReject<QList<int>_> *reject_local;
  QPromiseResolve<QList<int>_> *resolve_local;
  QPromise<QList<int>_> *promise_local;
  
  local_20 = (QPromiseReject<QList<int>> *)reject;
  reject_local = (QPromiseReject<QList<int>_> *)resolve;
  resolve_local = (QPromiseResolve<QList<int>_> *)promise;
  bVar1 = QtPromise::QPromiseBase<QList<int>_>::isFulfilled
                    (&promise->super_QPromiseBase<QList<int>_>);
  this_00 = reject_local;
  if (bVar1) {
    pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                       ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> *
                        )(resolve_local + 1));
    value = PromiseData<QList<int>_>::value(pPVar2);
    QtPromise::QPromiseResolve<QList<int>>::operator()((QPromiseResolve<QList<int>> *)this_00,value)
    ;
  }
  else {
    bVar1 = QtPromise::QPromiseBase<QList<int>_>::isRejected
                      ((QPromiseBase<QList<int>_> *)resolve_local);
    fulfilled = resolve_local;
    this = local_20;
    if (bVar1) {
      pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                         ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>
                           *)(resolve_local + 1));
      error = PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::error
                        (&pPVar2->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
      QtPromise::QPromiseReject<QList<int>>::operator()(this,error);
    }
    else {
      QtPromise::QPromiseResolve<QList<int>_>::QPromiseResolve
                ((QPromiseResolve<QList<int>_> *)&local_48,
                 (QPromiseResolve<QList<int>_> *)reject_local);
      QtPromise::QPromise<QList<int>_>::QPromise
                (&local_48.promise,(QPromise<QList<int>_> *)resolve_local);
      QtPromise::QPromiseReject<QList<int>_>::QPromiseReject
                (&local_70,(QPromiseReject<QList<int>_> *)local_20);
      QtPromise::QPromise<QList<int>_>::QPromise(local_68,(QPromise<QList<int>_> *)resolve_local);
      QtPromise::QPromiseBase<QList<int>>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)::_lambda()_2_>
                ((QPromiseBase<QList<int>> *)&local_30,(anon_class_24_2_e6a34898 *)fulfilled,
                 &local_48);
      QtPromise::QPromise<void>::~QPromise(&local_30);
      call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }